

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

string * __thiscall
Kernel::InferenceStore::TPTPProofPrinter::getNewSymbols
          (TPTPProofPrinter *this,string *origin,Unit *u)

{
  bool bVar1;
  DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *s;
  Unit *in_RCX;
  string *in_RDX;
  long in_RSI;
  DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_RDI;
  SymbolStack *syms;
  string *in_stack_00000120;
  TPTPProofPrinter *in_stack_00000128;
  undefined1 in_stack_00000130 [16];
  undefined8 in_stack_ffffffffffffff08;
  uint key;
  DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffff10;
  string local_a8 [32];
  Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *local_88;
  string local_70 [8];
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  TPTPProofPrinter *in_stack_ffffffffffffffa8;
  string local_50 [36];
  uint local_2c;
  Unit *local_20;
  
  key = (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  pDVar2 = in_RDI;
  local_20 = in_RCX;
  local_2c = Unit::number(in_RCX);
  Lib::
  DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::find(pDVar2,(uint *)in_RDX);
  bVar1 = Lib::Option::operator_cast_to_bool
                    ((Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)0x86fefe);
  if (bVar1) {
    std::__cxx11::string::string(local_50,in_RDX);
    pDVar2 = (DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
              *)(*(long *)(in_RSI + 0x70) + 0x78);
    Unit::number(local_20);
    pbVar3 = Lib::
             DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::get(pDVar2,key);
    std::__cxx11::string::string(local_70,(string *)pbVar3);
    getNewSymbols(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
  }
  else {
    s = (Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *)(*(long *)(in_RSI + 0x70) + 0x50);
    Unit::number(local_20);
    local_88 = Lib::
               DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::get(in_stack_ffffffffffffff10,(uint)((ulong)s >> 0x20));
    std::__cxx11::string::string(local_a8,in_RDX);
    Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_ffffffffffffff10,s);
    getNewSymbols<Lib::Stack<std::pair<Kernel::SymbolType,unsigned_int>>::ConstIterator>
              (in_stack_00000128,in_stack_00000120,(ConstIterator)in_stack_00000130);
    std::__cxx11::string::~string(local_a8);
  }
  return (string *)in_RDI;
}

Assistant:

std::string getNewSymbols(std::string origin, Unit* u) {
    ASS(hasNewSymbols(u));

    if(_is->_introducedSplitNames.find(u->number())){
      return getNewSymbols(origin,_is->_introducedSplitNames.get(u->number()));
    }

    SymbolStack& syms = _is->_introducedSymbols.get(u->number());
    return getNewSymbols(origin, SymbolStack::ConstIterator(syms));
  }